

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O1

string * __thiscall
duckdb::BoxRenderer::TryFormatLargeNumber
          (string *__return_storage_ptr__,BoxRenderer *this,string *numeric)

{
  char cVar1;
  char *pcVar2;
  char *__s;
  bool bVar3;
  undefined1 auVar4 [16];
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  string unit;
  string decimal_str;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70 [16];
  BoxRenderer *local_60;
  ulong local_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  uVar6 = numeric->_M_string_length;
  if (uVar6 < 6) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = (numeric->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    uVar7 = (ulong)(cVar1 == '-');
    if (uVar7 < uVar6) {
      uVar11 = 0;
      do {
        cVar9 = pcVar2[uVar7];
        iVar10 = 2;
        if (cVar9 != '.') {
          if (((byte)(cVar9 - 0x3aU) < 0xf6) || (999999999999999999 < uVar11)) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            iVar10 = 1;
          }
          else {
            uVar11 = (ulong)(byte)(cVar9 - 0x30) + uVar11 * 10;
            iVar10 = 0;
          }
        }
        if (iVar10 != 0) {
          if (iVar10 != 2) {
            return __return_storage_ptr__;
          }
          break;
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    else {
      uVar11 = 0;
    }
    local_80 = local_70;
    local_78 = (char *)0x0;
    local_70[0] = 0;
    lVar8 = 8;
    uVar6 = 0;
    local_60 = this;
    local_58 = uVar11;
    do {
      pcVar2 = local_78;
      uVar7 = *(ulong *)((long)&PTR___cxa_pure_virtual_02479458 + lVar8);
      if (uVar7 <= uVar7 / 200 + uVar11) {
        __s = *(char **)((long)&DAT_02479460 + lVar8);
        strlen(__s);
        ::std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar2,(ulong)__s);
        uVar6 = uVar7;
        uVar11 = local_58;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x58);
    if (local_78 == (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar11 + uVar6 / 200;
      uVar6 = SUB168(auVar4 / (ZEXT816(0) * ZEXT816(0x28f5c28f5c28f5c3) >> 0x42 &
                              (undefined1  [16])0x3fffffffffffffff),0);
      cVar9 = '\x01';
      if (9 < uVar6) {
        uVar7 = uVar6;
        cVar5 = '\x04';
        do {
          cVar9 = cVar5;
          if (uVar7 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00e62f8a;
          }
          if (uVar7 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00e62f8a;
          }
          if (uVar7 < 10000) goto LAB_00e62f8a;
          bVar3 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar5 = cVar9 + '\x04';
        } while (bVar3);
        cVar9 = cVar9 + '\x01';
      }
LAB_00e62f8a:
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar6);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (cVar1 == '-') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_50);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0[0]);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0]);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      ::std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_50);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0[0]);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0]);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::TryFormatLargeNumber(const string &numeric) {
	// we only return a readable rendering if the number is > 1 million
	if (numeric.size() <= 5) {
		// number too small for sure
		return string();
	}
	// get the number to summarize
	idx_t number = 0;
	bool negative = false;
	idx_t i = 0;
	if (numeric[0] == '-') {
		negative = true;
		i++;
	}
	for (; i < numeric.size(); i++) {
		char c = numeric[i];
		if (c == '.') {
			break;
		}
		if (c < '0' || c > '9') {
			// not a number or something funky (e.g. 1.23e7)
			// we could theoretically summarize numbers with exponents
			return string();
		}
		if (number >= 1000000000000000000ULL) {
			// number too big
			return string();
		}
		number = number * 10 + static_cast<idx_t>(c - '0');
	}
	struct UnitBase {
		idx_t base;
		const char *name;
	};
	static constexpr idx_t BASE_COUNT = 5;
	UnitBase bases[] = {{1000000ULL, "million"},
	                    {1000000000ULL, "billion"},
	                    {1000000000000ULL, "trillion"},
	                    {1000000000000000ULL, "quadrillion"},
	                    {1000000000000000000ULL, "quintillion"}};
	idx_t base = 0;
	string unit;
	for (idx_t i = 0; i < BASE_COUNT; i++) {
		// round the number according to this base
		idx_t rounded_number = number + ((bases[i].base / 100ULL) / 2);
		if (rounded_number >= bases[i].base) {
			base = bases[i].base;
			unit = bases[i].name;
		}
	}
	if (unit.empty()) {
		return string();
	}
	number += (base / 100ULL) / 2;
	idx_t decimal_unit = number / (base / 100ULL);
	string decimal_str = to_string(decimal_unit);
	string result;
	if (negative) {
		result += "-";
	}
	result += decimal_str.substr(0, decimal_str.size() - 2);
	result += config.decimal_separator == '\0' ? '.' : config.decimal_separator;
	result += decimal_str.substr(decimal_str.size() - 2, 2);
	result += " ";
	result += unit;
	return result;
}